

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  ImWchar IVar1;
  int iVar2;
  ImGuiInputTextState *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float w;
  int k;
  int i;
  float prev_x;
  float base_y;
  int n;
  StbTexteditRow r;
  int in_stack_ffffffffffffffbc;
  int char_idx;
  float in_stack_ffffffffffffffc4;
  float fVar3;
  float local_30;
  float fVar4;
  float in_stack_ffffffffffffffd8;
  float fVar5;
  float fVar6;
  int iVar7;
  int local_4;
  
  iVar2 = STB_TEXTEDIT_STRINGLEN(in_RDI);
  fVar3 = 0.0;
  fVar4 = 0.0;
  local_30 = 0.0;
  fVar6 = 0.0;
  fVar5 = 0.0;
  iVar7 = 0;
  for (char_idx = 0; char_idx < iVar2; char_idx = iVar7 + char_idx) {
    STB_TEXTEDIT_LAYOUTROW
              ((StbTexteditRow *)CONCAT44(iVar7,fVar6),
               (ImGuiInputTextState *)CONCAT44(fVar5,in_stack_ffffffffffffffd8),(int)fVar4);
    if (iVar7 < 1) {
      return iVar2;
    }
    if ((char_idx == 0) && (in_XMM1_Da < fVar3 + fVar5)) {
      return 0;
    }
    if (in_XMM1_Da < fVar3 + fVar6) break;
    fVar3 = in_stack_ffffffffffffffd8 + fVar3;
  }
  local_4 = iVar2;
  if ((char_idx < iVar2) && (local_4 = char_idx, 0.0 <= in_XMM0_Da)) {
    if (in_XMM0_Da < fVar4) {
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffc4 = local_30,
          in_stack_ffffffffffffffbc < iVar7;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        fVar4 = STB_TEXTEDIT_GETWIDTH
                          ((ImGuiInputTextState *)CONCAT44(iVar2,fVar3),(int)local_30,char_idx);
        if (in_XMM0_Da < local_30 + fVar4) {
          if (in_XMM0_Da < local_30 + fVar4 / 2.0) {
            return in_stack_ffffffffffffffbc + char_idx;
          }
          return in_stack_ffffffffffffffbc + char_idx + 1;
        }
        local_30 = fVar4 + local_30;
      }
    }
    IVar1 = STB_TEXTEDIT_GETCHAR
                      ((ImGuiInputTextState *)CONCAT44(in_stack_ffffffffffffffc4,char_idx),
                       in_stack_ffffffffffffffbc);
    if (IVar1 == STB_TEXTEDIT_NEWLINE) {
      local_4 = char_idx + iVar7 + -1;
    }
    else {
      local_4 = char_idx + iVar7;
    }
  }
  return local_4;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}